

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_decoder.hpp
# Opt level: O0

bool __thiscall
jsoncons::
json_decoder<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::allocator<char>_>
::visit_uint64(json_decoder<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::allocator<char>_>
               *this,uint64_t value,semantic_tag tag,ser_context *param_4,error_code *param_5)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__args;
  reference pvVar1;
  basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *in_RDI;
  vector<jsoncons::index_key_value<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::index_key_value<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
  *in_R8;
  uint in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb4;
  structure_type sVar2;
  unsigned_long *in_stack_ffffffffffffffb8;
  unsigned_long *in_stack_ffffffffffffffc0;
  
  pvVar1 = std::
           vector<jsoncons::json_decoder<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::allocator<char>_>::structure_info,_std::allocator<jsoncons::json_decoder<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::allocator<char>_>::structure_info>_>
           ::back((vector<jsoncons::json_decoder<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::allocator<char>_>::structure_info,_std::allocator<jsoncons::json_decoder<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::allocator<char>_>::structure_info>_>
                   *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0));
  sVar2 = pvVar1->type_;
  if (sVar2 == root_t) {
    jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>::
    basic_json<unsigned_long>(unsigned_long,jsoncons::semantic_tag,std::enable_if<ext_traits::
    is_unsigned_integer<unsigned_long>::value&&((sizeof(unsigned_long))<=(8ul)),int>::type_
              ((basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)
               (ulong)in_stack_ffffffffffffffb0,(unsigned_long)in_RDI,none,0x1f5b5b);
    basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::operator=
              ((basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)
               CONCAT44(sVar2,in_stack_ffffffffffffffb0),in_RDI);
    basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::~basic_json
              ((basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)0x1f5b77);
    in_RDI[7].field_0.short_str_.data_[6] = '\x01';
  }
  else if (sVar2 == array_t || sVar2 == object_t) {
    __args = *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
              &in_RDI[2].field_0;
    *(undefined1 **)&in_RDI[2].field_0 = &__args->field_0x1;
    std::
    vector<jsoncons::index_key_value<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>,std::allocator<jsoncons::index_key_value<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>>>
    ::emplace_back<std::__cxx11::string,unsigned_long,unsigned_long&,jsoncons::semantic_tag&>
              (in_R8,__args,in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,
               (semantic_tag *)CONCAT44(sVar2,in_stack_ffffffffffffffb0));
  }
  return true;
}

Assistant:

JSONCONS_VISITOR_RETURN_TYPE visit_uint64(uint64_t value, 
        semantic_tag tag, 
        const ser_context&,
        std::error_code&) override
    {
        switch (structure_stack_.back().type_)
        {
            case structure_type::object_t:
            case structure_type::array_t:
                item_stack_.emplace_back(std::move(name_), index_++, value, tag);
                break;
            case structure_type::root_t:
                result_ = Json(value,tag);
                is_valid_ = true;
                JSONCONS_VISITOR_RETURN;
        }
        JSONCONS_VISITOR_RETURN;
    }